

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O3

void __thiscall bidfx_public_api::tools::ByteBuffer::Compact(ByteBuffer *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = this->reader_index_;
  uVar3 = this->writer_index_;
  if (uVar2 < uVar3) {
    lVar4 = 0;
    do {
      this->buf_[lVar4] = this->buf_[uVar2 + lVar4];
      uVar3 = this->writer_index_;
      lVar1 = uVar2 + lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar1 + 1U < uVar3);
    uVar2 = this->reader_index_;
  }
  this->writer_index_ = uVar3 - uVar2;
  this->reader_index_ = 0;
  return;
}

Assistant:

void ByteBuffer::Compact()
{
    int count = 0;
    for (size_t i = reader_index_; i < writer_index_; i++)
    {
        buf_[count] = buf_[i];
        count++;
    }
    writer_index_ -= reader_index_;
    reader_index_ = 0;
}